

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argsman_tests.cpp
# Opt level: O2

void __thiscall argsman_tests::util_NoIncludeConf::test_method(util_NoIncludeConf *this)

{
  iterator in_R8;
  iterator pvVar1;
  iterator in_R9;
  string *psVar2;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string file;
  const_string file_00;
  const_string file_01;
  char *local_108;
  char *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  undefined **local_98;
  undefined1 local_90;
  undefined1 *local_88;
  char *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  char *local_68;
  char *local_60;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_60 = "";
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0xcc;
  file.m_begin = (iterator)&local_68;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_78,msg);
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01139f30;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = "";
  local_a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_a0 = "";
  NoIncludeConfTest::Parse_abi_cxx11_(&local_58,(NoIncludeConfTest *)this,"-noincludeconf");
  pvVar1 = (iterator)0x2;
  psVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
            (&local_98,&local_a8,0xcc,1,2,psVar2,"Parse(\"-noincludeconf\")","","\"\"");
  std::__cxx11::string::~string((string *)&local_58);
  local_b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_b0 = "";
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)psVar2;
  msg_00.m_begin = pvVar1;
  file_00.m_end = (iterator)0xcd;
  file_00.m_begin = (iterator)&local_b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_c8,msg_00
            );
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01139f30;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = "";
  local_d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_d0 = "";
  NoIncludeConfTest::Parse_abi_cxx11_(&local_58,(NoIncludeConfTest *)this,"-includeconf");
  pvVar1 = (iterator)0x2;
  psVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[62]>
            (&local_98,&local_d8,0xcd,1,2,psVar2,"Parse(\"-includeconf\")",
             "-includeconf cannot be used from commandline; -includeconf=\"\"",
             "\"-includeconf cannot be used from commandline; -includeconf=\\\"\\\"\"");
  std::__cxx11::string::~string((string *)&local_58);
  local_e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_e0 = "";
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = (iterator)psVar2;
  msg_01.m_begin = pvVar1;
  file_01.m_end = (iterator)0xce;
  file_01.m_begin = (iterator)&local_e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_f8,msg_01
            );
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_01139f30;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = "";
  local_108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_100 = "";
  NoIncludeConfTest::Parse_abi_cxx11_(&local_58,(NoIncludeConfTest *)this,"-includeconf=file");
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[66]>
            (&local_98,&local_108,0xce,1,2,&local_58,"Parse(\"-includeconf=file\")",
             "-includeconf cannot be used from commandline; -includeconf=\"file\"",
             "\"-includeconf cannot be used from commandline; -includeconf=\\\"file\\\"\"");
  std::__cxx11::string::~string((string *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(util_NoIncludeConf, NoIncludeConfTest)
{
    BOOST_CHECK_EQUAL(Parse("-noincludeconf"), "");
    BOOST_CHECK_EQUAL(Parse("-includeconf"), "-includeconf cannot be used from commandline; -includeconf=\"\"");
    BOOST_CHECK_EQUAL(Parse("-includeconf=file"), "-includeconf cannot be used from commandline; -includeconf=\"file\"");
}